

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

xmlDictPtr xmlDictCreateSub(xmlDictPtr sub)

{
  xmlDictPtr pxVar1;
  
  pxVar1 = xmlDictCreate();
  if (sub != (xmlDictPtr)0x0 && pxVar1 != (xmlDictPtr)0x0) {
    pxVar1->seed = sub->seed;
    pxVar1->subdict = sub;
    xmlMutexLock(&xmlDictMutex);
    sub->ref_counter = sub->ref_counter + 1;
    xmlMutexUnlock(&xmlDictMutex);
  }
  return pxVar1;
}

Assistant:

xmlDictPtr
xmlDictCreateSub(xmlDictPtr sub) {
    xmlDictPtr dict = xmlDictCreate();

    if ((dict != NULL) && (sub != NULL)) {
        dict->seed = sub->seed;
        dict->subdict = sub;
	xmlDictReference(dict->subdict);
    }
    return(dict);
}